

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedNonMS<tcu::Vector<float,_4>,_5>::Run
          (AdvancedNonMS<tcu::Vector<float,_4>,_5> *this)

{
  CallLogWrapper *this_00;
  long lVar1;
  GLint level;
  GLuint texture;
  GLuint unit;
  GLboolean layered;
  GLint layer;
  int i;
  ulong uVar2;
  GLenum *pGVar3;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 res [7];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pGVar3 = &DAT_01ae4710;
  uVar2 = 0;
  do {
    GVar4 = *pGVar3;
    glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[uVar2]);
    if (uVar2 == 6) {
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x400,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glTexBufferRange(this_00,0x8c2a,0x8814,this->m_buffer,0x100,0x200);
      texture = this->m_texture[6];
      unit = 7;
      level = 0;
      layered = '\0';
      layer = 0;
      GVar4 = 0x88b9;
      goto LAB_00a2ccd3;
    }
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
    switch(uVar2 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,0,0x8814,2,2,7,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,1,0x8814,1,1,7,0,0x1908,0x1406,(void *)0x0);
      texture = this->m_texture[uVar2];
      unit = 1;
      layered = '\0';
      layer = 3;
      goto LAB_00a2ccc9;
    case 1:
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,0,0x8814,4,4,2,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,1,0x8814,2,2,1,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,2,0x8814,1,1,1,0,0x1908,0x1406,(void *)0x0);
      texture = this->m_texture[uVar2];
      unit = 2;
      break;
    case 2:
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,0,0x8814,2,2,0xc,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,1,0x8814,1,1,0xc,0,0x1908,0x1406,(void *)0x0);
      texture = this->m_texture[uVar2];
      unit = 3;
      layer = 1;
      goto LAB_00a2ca1c;
    case 3:
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,0,0x8814,4,4,0x12,0,0x1908,0x1406,(void *)0x0)
      ;
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,1,0x8814,2,2,0x12,0,0x1908,0x1406,(void *)0x0)
      ;
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,2,0x8814,1,1,0x12,0,0x1908,0x1406,(void *)0x0)
      ;
      texture = this->m_texture[uVar2];
      unit = 4;
      break;
    case 4:
      glu::CallLogWrapper::glTexImage2D(this_00,GVar4,0,0x8814,0x7b,0xb,0,0x1908,0x1406,(void *)0x0)
      ;
      texture = this->m_texture[uVar2];
      unit = 5;
      layer = 0;
LAB_00a2ca1c:
      layered = '\0';
      level = 0;
      GVar4 = 0x88ba;
      goto LAB_00a2ccd3;
    case 5:
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,0,0x8814,0xd,7,4,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,1,0x8814,6,3,4,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,2,0x8814,3,1,4,0,0x1908,0x1406,(void *)0x0);
      glu::CallLogWrapper::glTexImage3D(this_00,GVar4,3,0x8814,1,1,4,0,0x1908,0x1406,(void *)0x0);
      texture = this->m_texture[uVar2];
      unit = 6;
      break;
    default:
      goto switchD_00a2c8a1_default;
    }
    layered = '\x01';
    layer = 0;
LAB_00a2ccc9:
    level = 1;
    GVar4 = 35000;
LAB_00a2ccd3:
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,layer,GVar4,0x8814);
switchD_00a2c8a1_default:
    uVar2 = uVar2 + 1;
    pGVar3 = pGVar3 + 1;
    if (uVar2 == 7) {
      ImageSizeMachine::ImageSizeMachine(&machine);
      res[0].m_data._0_8_ = &DAT_100000001;
      res[0].m_data[2] = 0;
      res[0].m_data[3] = 0;
      res[1].m_data[0] = 2;
      res[1].m_data[1] = 2;
      res[1].m_data[2] = 1;
      res[1].m_data[3] = 0;
      res[2].m_data[0] = 2;
      res[2].m_data[1] = 2;
      res[2].m_data[2] = 0;
      res[2].m_data[3] = 0;
      res[3].m_data[0] = 2;
      res[3].m_data[1] = 2;
      res[3].m_data[2] = 3;
      res[3].m_data[3] = 0;
      res[4].m_data[0] = 0x7b;
      res[4].m_data[1] = 0xb;
      res[4].m_data[2] = 0;
      res[4].m_data[3] = 0;
      res[5].m_data[0] = 6;
      res[5].m_data[1] = 3;
      res[5].m_data[2] = 4;
      res[5].m_data[3] = 0;
      res[6].m_data[0] = 0x20;
      res[6].m_data[1] = 0;
      res[6].m_data[2] = 0;
      res[6].m_data[3] = 0;
      lVar1 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<float,4>>
                        ((ImageSizeMachine *)&machine,5,false,res,true);
      ImageSizeMachine::~ImageSizeMachine(&machine);
      return lVar1;
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D_ARRAY,		  GL_TEXTURE_3D,		GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 2, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 2, 2, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 1, 1, 12, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 4, 4, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 2, 2, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 1, 1, 18, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 123, 11, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexImage3D(target[i], 0, TexInternalFormat<T>(), 13, 7, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 1, TexInternalFormat<T>(), 6, 3, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 2, TexInternalFormat<T>(), 3, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage3D(target[i], 3, TexInternalFormat<T>(), 1, 1, 4, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(6, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 1024, NULL, GL_STATIC_DRAW);
				glTexBufferRange(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer, 256, 512);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(1, 1, 0, 0),	ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(2, 2, 3, 0),
						 ivec4(123, 11, 0, 0), ivec4(6, 3, 4, 0), ivec4(32, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res, true);
	}